

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DepthSpecsOf.hpp
# Opt level: O1

void __thiscall
sciplot::DepthSpecsOf<sciplot::GridSpecsBase>::DepthSpecsOf
          (DepthSpecsOf<sciplot::GridSpecsBase> *this,void **vtt)

{
  void *pvVar1;
  
  pvVar1 = *vtt;
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x28)) = vtt[1];
  (this->m_depth)._M_dataplus._M_p = (pointer)&(this->m_depth).field_2;
  (this->m_depth)._M_string_length = 0;
  (this->m_depth).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_replace((ulong)&this->m_depth,0,(char *)0x0,0x18e455);
  return;
}

Assistant:

DepthSpecsOf<DerivedSpecs>::DepthSpecsOf()
{
    back();
}